

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

void __thiscall wasm::TypeMapper::TypeMapper(TypeMapper *this,Module *wasm,TypeUpdates *mapping)

{
  TypeUpdates *mapping_local;
  Module *wasm_local;
  TypeMapper *this_local;
  
  GlobalTypeRewriter::GlobalTypeRewriter(&this->super_GlobalTypeRewriter,wasm);
  (this->super_GlobalTypeRewriter)._vptr_GlobalTypeRewriter =
       (_func_int **)&PTR__TypeMapper_03099eb8;
  this->mapping = mapping;
  std::
  unordered_map<wasm::HeapType,_wasm::Signature,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::Signature>_>_>
  ::unordered_map(&this->newSignatures);
  return;
}

Assistant:

TypeMapper(Module& wasm, const TypeUpdates& mapping)
    : GlobalTypeRewriter(wasm), mapping(mapping) {}